

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int SetAllPWMsPololu(POLOLU *pPololu,int *selectedchannels,int *pws)

{
  int iVar1;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int nbselectedchannels;
  int firstselectedchannel;
  int index;
  int pws_tmp [24];
  int local_230;
  int target;
  int channel;
  int sendbuflen;
  uchar sendbuf [512];
  int *pws_local;
  int *selectedchannels_local;
  POLOLU *pPololu_local;
  
  pws_tmp[0x17] = 0;
  sendbuf._504_8_ = pws;
  memset(&channel,0,0x200);
  if (pPololu->bEnableSetMultipleTargets == 0) {
    local_2a4 = 0;
    nbselectedchannels = 0;
    memcpy(&firstselectedchannel,(void *)sendbuf._504_8_,0x60);
    for (local_230 = 0; local_230 < 0x18; local_230 = local_230 + 1) {
      if (selectedchannels[local_230] != 0) {
        if (pPololu->bProportionalPWs[local_230] == 0) {
          (&firstselectedchannel)[local_230] =
               (int)(pPololu->CoefPWs[local_230] *
                    (double)((&firstselectedchannel)[local_230] + -0x5dc)) + 0x5dc;
        }
        else {
          (&firstselectedchannel)[local_230] =
               (int)(pPololu->CoefPWs[local_230] *
                    (double)((&firstselectedchannel)[local_230] + -0x5dc));
          if ((&firstselectedchannel)[local_230] < 0) {
            (&firstselectedchannel)[local_230] =
                 pPololu->MidPWs[local_230] +
                 ((&firstselectedchannel)[local_230] *
                 (pPololu->MinPWs[local_230] - pPololu->MidPWs[local_230])) / -500;
          }
          else {
            (&firstselectedchannel)[local_230] =
                 pPololu->MidPWs[local_230] +
                 ((&firstselectedchannel)[local_230] *
                 (pPololu->MaxPWs[local_230] - pPololu->MidPWs[local_230])) / 500;
          }
        }
        if ((&firstselectedchannel)[local_230] < pPololu->MaxPWs[local_230]) {
          local_2b8 = (&firstselectedchannel)[local_230];
        }
        else {
          local_2b8 = pPololu->MaxPWs[local_230];
        }
        if (pPololu->MinPWs[local_230] < local_2b8) {
          if ((&firstselectedchannel)[local_230] < pPololu->MaxPWs[local_230]) {
            local_2bc = (&firstselectedchannel)[local_230];
          }
          else {
            local_2bc = pPololu->MaxPWs[local_230];
          }
          local_2c0 = local_2bc;
        }
        else {
          local_2c0 = pPololu->MinPWs[local_230];
        }
        (&firstselectedchannel)[local_230] = local_2c0;
        iVar1 = (&firstselectedchannel)[local_230] - pPololu->LastPWs[local_230];
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (pPololu->ThresholdPWs[local_230] <= iVar1) {
          *(undefined1 *)((long)&channel + (long)nbselectedchannels) = 0xaa;
          *(char *)((long)&channel + (long)(nbselectedchannels + 1)) = (char)pPololu->DeviceNumber;
          *(undefined1 *)((long)&channel + (long)(nbselectedchannels + 2)) = 4;
          *(char *)((long)&channel + (long)(nbselectedchannels + 3)) = (char)local_230;
          pws_tmp[0x17] = (&firstselectedchannel)[local_230] << 2;
          *(byte *)((long)&channel + (long)(nbselectedchannels + 4)) = (byte)pws_tmp[0x17] & 0x7f;
          *(byte *)((long)&channel + (long)(nbselectedchannels + 5)) =
               (byte)(pws_tmp[0x17] >> 7) & 0x7f;
          local_2a4 = local_2a4 + 1;
          nbselectedchannels = nbselectedchannels + 6;
        }
      }
    }
    if (local_2a4 == 0) {
      return 0;
    }
    target = local_2a4 * 6;
  }
  else {
    channel._0_1_ = 0xaa;
    channel._1_1_ = (undefined1)pPololu->DeviceNumber;
    channel._2_1_ = 0x1f;
    local_2a0 = 0x18;
    local_2a4 = 0;
    nbselectedchannels = 5;
    memcpy(&firstselectedchannel,(void *)sendbuf._504_8_,0x60);
    for (local_230 = 0; local_230 < 0x18; local_230 = local_230 + 1) {
      if (selectedchannels[local_230] != 0) {
        if (local_2a0 + local_2a4 < local_230) {
          printf("Pololu multiple channels must be continuous.\n");
          return 1;
        }
        if (pPololu->bProportionalPWs[local_230] == 0) {
          (&firstselectedchannel)[local_230] =
               (int)(pPololu->CoefPWs[local_230] *
                    (double)((&firstselectedchannel)[local_230] + -0x5dc)) + 0x5dc;
        }
        else {
          (&firstselectedchannel)[local_230] =
               (int)(pPololu->CoefPWs[local_230] *
                    (double)((&firstselectedchannel)[local_230] + -0x5dc));
          if ((&firstselectedchannel)[local_230] < 0) {
            (&firstselectedchannel)[local_230] =
                 pPololu->MidPWs[local_230] +
                 ((&firstselectedchannel)[local_230] *
                 (pPololu->MinPWs[local_230] - pPololu->MidPWs[local_230])) / -500;
          }
          else {
            (&firstselectedchannel)[local_230] =
                 pPololu->MidPWs[local_230] +
                 ((&firstselectedchannel)[local_230] *
                 (pPololu->MaxPWs[local_230] - pPololu->MidPWs[local_230])) / 500;
          }
        }
        if ((&firstselectedchannel)[local_230] < pPololu->MaxPWs[local_230]) {
          local_2a8 = (&firstselectedchannel)[local_230];
        }
        else {
          local_2a8 = pPololu->MaxPWs[local_230];
        }
        if (pPololu->MinPWs[local_230] < local_2a8) {
          if ((&firstselectedchannel)[local_230] < pPololu->MaxPWs[local_230]) {
            local_2ac = (&firstselectedchannel)[local_230];
          }
          else {
            local_2ac = pPololu->MaxPWs[local_230];
          }
          local_2b0 = local_2ac;
        }
        else {
          local_2b0 = pPololu->MinPWs[local_230];
        }
        (&firstselectedchannel)[local_230] = local_2b0;
        iVar1 = (&firstselectedchannel)[local_230] - pPololu->LastPWs[local_230];
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (iVar1 < pPololu->ThresholdPWs[local_230]) {
          (&firstselectedchannel)[local_230] = pPololu->LastPWs[local_230];
        }
        pws_tmp[0x17] = (&firstselectedchannel)[local_230] << 2;
        *(byte *)((long)&channel + (long)nbselectedchannels) = (byte)pws_tmp[0x17] & 0x7f;
        *(byte *)((long)&channel + (long)(nbselectedchannels + 1)) =
             (byte)(pws_tmp[0x17] >> 7) & 0x7f;
        if (local_230 < local_2a0) {
          local_2b4 = local_230;
        }
        else {
          local_2b4 = local_2a0;
        }
        local_2a0 = local_2b4;
        local_2a4 = local_2a4 + 1;
        nbselectedchannels = nbselectedchannels + 2;
      }
    }
    if (local_2a4 == 0) {
      return 0;
    }
    channel._3_1_ = (undefined1)local_2a4;
    sendbuflen._0_1_ = (undefined1)local_2a0;
    target = local_2a4 * 2 + 5;
  }
  iVar1 = WriteAllRS232Port(&pPololu->RS232Port,(uint8 *)&channel,target);
  if (iVar1 == 0) {
    if ((pPololu->bSaveRawData != 0) && (pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(&channel,(long)target,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    for (local_230 = 0; local_230 < 0x18; local_230 = local_230 + 1) {
      if (selectedchannels[local_230] != 0) {
        iVar1 = (&firstselectedchannel)[local_230] - pPololu->LastPWs[local_230];
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (pPololu->ThresholdPWs[local_230] <= iVar1) {
          pPololu->LastPWs[local_230] = (&firstselectedchannel)[local_230];
        }
      }
    }
    pPololu_local._4_4_ = 0;
  }
  else {
    pPololu_local._4_4_ = 1;
  }
  return pPololu_local._4_4_;
}

Assistant:

inline int SetAllPWMsPololu(POLOLU* pPololu, int* selectedchannels, int* pws)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int channel = 0;
	int target = 0;
	int pws_tmp[NB_CHANNELS_PWM_POLOLU];
	int index = 0, firstselectedchannel = 0, nbselectedchannels = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	if (pPololu->bEnableSetMultipleTargets)
	{
		sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
		sendbuf[2] = (unsigned char)(SET_MULTIPLE_TARGETS_COMMAND_POLOLU & 0x7F);

		firstselectedchannel = NB_CHANNELS_PWM_POLOLU;
		nbselectedchannels = 0;
		index = 5;

		memcpy(pws_tmp, pws, sizeof(pws_tmp));

		for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
		{
			if (!selectedchannels[channel]) continue;

			// To check...
			if (channel > firstselectedchannel+nbselectedchannels)
			{
				printf("Pololu multiple channels must be continuous.\n");
				return EXIT_FAILURE;
			}

			if (pPololu->bProportionalPWs[channel])
			{
				pws_tmp[channel] = (int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
				if (pws_tmp[channel] >= 0)
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
				else
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
			}
			else
			{
				pws_tmp[channel] = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
			}

			pws_tmp[channel] = max(min(pws_tmp[channel], pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
			//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

			// The requested PWM is only applied if it is slightly different from the current value.
			if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) pws_tmp[channel] = pPololu->LastPWs[channel];

			//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pPololu->LastPWs[channel], abs(pws_tmp[channel]-pPololu->LastPWs[channel]), pPololu->ThresholdPWs[channel]);

			target = pws_tmp[channel]*4;
			sendbuf[index] = (unsigned char)(target & 0x7F);
			sendbuf[index+1] = (unsigned char)((target >> 7) & 0x7F);

			firstselectedchannel = min(channel, firstselectedchannel);
			nbselectedchannels++;
			index += 2;
		}

		if (nbselectedchannels == 0) return EXIT_SUCCESS;

		sendbuf[3] = (unsigned char)nbselectedchannels;
		sendbuf[4] = (unsigned char)firstselectedchannel;

		sendbuflen = 5+2*nbselectedchannels;
	}
	else
	{
		nbselectedchannels = 0;
		index = 0;

		memcpy(pws_tmp, pws, sizeof(pws_tmp));

		for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
		{
			if (!selectedchannels[channel]) continue;

			if (pPololu->bProportionalPWs[channel])
			{
				pws_tmp[channel] = (int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
				if (pws_tmp[channel] >= 0)
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
				else
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
			}
			else
			{
				pws_tmp[channel] = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
			}

			pws_tmp[channel] = max(min(pws_tmp[channel], pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
			//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

			// The requested PWM is only applied if it is slightly different from the current value.
			if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) continue;

			//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pPololu->LastPWs[channel], abs(pws_tmp[channel]-pPololu->LastPWs[channel]), pPololu->ThresholdPWs[channel]);

			sendbuf[index] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
			sendbuf[index+1] = (unsigned char)pPololu->DeviceNumber;
			sendbuf[index+2] = (unsigned char)(SET_TARGET_COMMAND_POLOLU & 0x7F);
			sendbuf[index+3] = (unsigned char)channel;
			target = pws_tmp[channel]*4;
			sendbuf[index+4] = (unsigned char)(target & 0x7F);
			sendbuf[index+5] = (unsigned char)((target >> 7) & 0x7F);

			nbselectedchannels++;
			index += 6;
		}

		if (nbselectedchannels == 0) return EXIT_SUCCESS;

		sendbuflen = 6*nbselectedchannels;
	}

	//printf("%s\n", sendbuf);

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) continue;

		// Update last known value.
		pPololu->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}